

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day03.cpp
# Opt level: O1

void day03(input_t input)

{
  short *psVar1;
  undefined2 uVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  undefined4 uVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 uVar10;
  int iVar11;
  uint uVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  short sVar15;
  ulong uVar16;
  long lVar17;
  __normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>
  __i;
  long lVar18;
  char *pcVar19;
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  array<unsigned_short,_5UL> arr;
  array<unsigned_long,_17UL> row;
  array<unsigned_long,_17UL> collide;
  short local_182 [3];
  byte local_17c;
  undefined2 local_17a;
  undefined1 (*local_178) [16];
  ulong local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  ulong local_148 [2];
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  ulong local_b8 [17];
  undefined1 auVar26 [32];
  
  lVar18 = input.len;
  pcVar19 = input.s;
  pauVar13 = (undefined1 (*) [16])operator_new(36000);
  pauVar21 = pauVar13 + 0x8ca;
  pauVar20 = pauVar13;
  if (lVar18 != 0) {
    sVar15 = 0;
    bVar8 = false;
    iVar11 = 0;
    do {
      if ((byte)(*pcVar19 - 0x30U) < 10) {
        sVar15 = (ushort)(byte)(*pcVar19 - 0x30U) + sVar15 * 10;
        bVar8 = true;
      }
      else if (bVar8) {
        lVar17 = (long)iVar11;
        iVar11 = iVar11 + 1;
        local_182[lVar17] = sVar15;
        if (iVar11 == 5) {
          if (pauVar20 == pauVar21) {
            local_178 = pauVar21;
            if ((long)pauVar20 - (long)pauVar13 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar17 = (long)pauVar20 - (long)pauVar13 >> 3;
            uVar22 = lVar17 * -0x5555555555555555;
            uVar16 = uVar22;
            if (pauVar20 == pauVar13) {
              uVar16 = 1;
            }
            local_170 = uVar16 + uVar22;
            if (0x555555555555554 < local_170) {
              local_170 = 0x555555555555555;
            }
            if (CARRY8(uVar16,uVar22)) {
              local_170 = 0x555555555555555;
            }
            if (local_170 == 0) {
              pauVar14 = (undefined1 (*) [16])0x0;
            }
            else {
              pauVar14 = (undefined1 (*) [16])operator_new(local_170 * 0x18);
            }
            *(short *)(pauVar14[1] + lVar17 * 8) = local_182[0];
            *(short *)(pauVar14[1] + lVar17 * 8 + 2) = local_182[2];
            *(undefined2 *)(pauVar14[1] + lVar17 * 8 + 4) = local_17a;
            pauVar14[1][lVar17 * 8 + 7] = 1;
            uVar12 = (ushort)local_182[1] & 0x3f;
            uVar22 = ~(-1L << ((ulong)local_17c & 0x3f));
            uVar16 = uVar22 >> ((ulong)(byte)-(char)uVar12 & 0x3f);
            if ((ulong)uVar12 == 0) {
              uVar16 = 0;
            }
            pauVar14[1][lVar17 * 8 + 6] = (char)((ushort)local_182[1] >> 6);
            *(ulong *)(*pauVar14 + lVar17 * 8) = uVar22 << (ulong)uVar12;
            *(ulong *)(*pauVar14 + lVar17 * 8 + 8) = uVar16;
            pauVar23 = pauVar14;
            for (pauVar21 = pauVar13; pauVar20 != pauVar21;
                pauVar21 = (undefined1 (*) [16])(pauVar21[1] + 8)) {
              *(undefined8 *)pauVar23[1] = *(undefined8 *)pauVar21[1];
              uVar10 = *(undefined8 *)(*pauVar21 + 8);
              *(undefined8 *)*pauVar23 = *(undefined8 *)*pauVar21;
              *(undefined8 *)(*pauVar23 + 8) = uVar10;
              pauVar23 = (undefined1 (*) [16])(pauVar23[1] + 8);
            }
            if (pauVar13 != (undefined1 (*) [16])0x0) {
              operator_delete(pauVar13,(long)local_178 - (long)pauVar13);
            }
            pauVar20 = (undefined1 (*) [16])(pauVar23[1] + 8);
            pauVar21 = (undefined1 (*) [16])((long)pauVar14 + local_170 * 0x18);
            iVar11 = 0;
            bVar8 = false;
            sVar15 = 0;
            pauVar13 = pauVar14;
            goto LAB_00104e33;
          }
          *(short *)pauVar20[1] = local_182[0];
          *(short *)(pauVar20[1] + 2) = local_182[2];
          *(undefined2 *)(pauVar20[1] + 4) = local_17a;
          pauVar20[1][7] = 1;
          pauVar20[1][6] = (char)((ushort)local_182[1] >> 6);
          uVar12 = (ushort)local_182[1] & 0x3f;
          uVar16 = ~(-1L << ((ulong)local_17c & 0x3f));
          *(ulong *)*pauVar20 = uVar16 << (ulong)uVar12;
          uVar16 = uVar16 >> ((ulong)(byte)-(char)uVar12 & 0x3f);
          if ((ulong)uVar12 == 0) {
            uVar16 = 0;
          }
          *(ulong *)(*pauVar20 + 8) = uVar16;
          pauVar20 = (undefined1 (*) [16])(pauVar20[1] + 8);
          iVar11 = 0;
        }
        bVar8 = false;
        sVar15 = 0;
      }
      else {
        bVar8 = false;
      }
LAB_00104e33:
      lVar18 = lVar18 + -1;
      pcVar19 = pcVar19 + 1;
    } while (lVar18 != 0);
  }
  if (pauVar13 != pauVar20) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pauVar13,pauVar20,
               (int)LZCOUNT(((long)pauVar20 - (long)pauVar13 >> 3) * -0x5555555555555555) * 2 ^ 0x7e
              );
    if ((long)pauVar20 - (long)pauVar13 < 0x181) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pauVar13,pauVar20);
    }
    else {
      pauVar14 = pauVar13 + 0x18;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pauVar13,pauVar14);
      for (; pauVar14 != pauVar20; pauVar14 = (undefined1 (*) [16])(pauVar14[1] + 8)) {
        uVar2 = *(undefined2 *)pauVar14[1];
        uStack_138 = CONCAT62(uStack_138._2_6_,uVar2);
        local_148[0] = *(ulong *)*pauVar14;
        local_148[1] = *(ulong *)(*pauVar14 + 8);
        uVar3 = *(ushort *)(pauVar14[1] + 2);
        uVar6 = *(undefined4 *)(pauVar14[1] + 4);
        uVar4 = *(ushort *)(pauVar14[-1] + 10);
        pauVar23 = pauVar14;
        while (uVar4 < uVar3) {
          *(undefined8 *)pauVar23[1] = *(undefined8 *)(pauVar23[-1] + 8);
          *(undefined8 *)*pauVar23 = *(undefined8 *)(pauVar23[-2] + 8);
          *(undefined8 *)(*pauVar23 + 8) = *(undefined8 *)pauVar23[-1];
          uVar4 = *(ushort *)(pauVar23[-2] + 2);
          pauVar23 = (undefined1 (*) [16])(pauVar23[-2] + 8);
        }
        *(undefined2 *)pauVar23[1] = uVar2;
        *(ulong *)*pauVar23 = local_148[0];
        *(ulong *)(*pauVar23 + 8) = local_148[1];
        *(ushort *)(pauVar23[1] + 2) = uVar3;
        *(undefined4 *)(pauVar23[1] + 4) = uVar6;
      }
    }
  }
  if (pauVar13 == pauVar20) {
    uVar22 = 0;
    uVar16 = 0;
  }
  else {
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28 = vpbroadcastq_avx512f(ZEXT816(0x11));
    uVar16 = 0;
    uVar22 = 0;
    do {
      local_108 = 0;
      uStack_100 = 0;
      uStack_f8 = 0;
      uStack_f0 = 0;
      uStack_e8 = 0;
      uStack_e0 = 0;
      uStack_d8 = 0;
      uStack_d0 = 0;
      local_148[0] = 0;
      local_148[1] = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      local_c8 = 0;
      local_b8[0] = 0;
      local_b8[1] = 0;
      local_b8[2] = 0;
      local_b8[3] = 0;
      local_b8[4] = 0;
      local_b8[5] = 0;
      local_b8[6] = 0;
      local_b8[7] = 0;
      local_b8[8] = 0;
      local_b8[9] = 0;
      local_b8[10] = 0;
      local_b8[0xb] = 0;
      local_b8[0xc] = 0;
      local_b8[0xd] = 0;
      local_b8[0xe] = 0;
      local_b8[0xf] = 0;
      local_b8[0x10] = 0;
      sVar15 = *(short *)(pauVar20[-1] + 10);
      pauVar14 = pauVar20;
      while ((pauVar23 = pauVar20, pauVar14 != pauVar13 && (*(short *)(pauVar14[-1] + 10) == sVar15)
             )) {
        uVar9 = (ulong)(byte)pauVar14[-1][0xe];
        uVar7 = local_148[uVar9 + 1];
        local_b8[uVar9] = local_b8[uVar9] | *(ulong *)(pauVar14[-2] + 8) & local_148[uVar9];
        local_148[uVar9] = local_148[uVar9] | *(ulong *)(pauVar14[-2] + 8);
        local_b8[uVar9 + 1] = local_b8[uVar9 + 1] | *(ulong *)pauVar14[-1] & uVar7;
        pauVar23 = pauVar14 + -1;
        pauVar14 = (undefined1 (*) [16])(pauVar14[-2] + 8);
        local_148[uVar9 + 1] = uVar7 | *(ulong *)*pauVar23;
      }
      while ((pauVar14 = pauVar23, pauVar14 != pauVar13 &&
             (sVar5 = *(short *)(pauVar14[-1] + 10), sVar5 == sVar15))) {
        if ((pauVar14[-1][0xf] == '\x01') &&
           (((local_b8[(byte)pauVar14[-1][0xe]] & *(ulong *)(pauVar14[-2] + 8)) != 0 ||
            ((local_b8[(ulong)(byte)pauVar14[-1][0xe] + 1] & *(ulong *)pauVar14[-1]) != 0)))) {
          pauVar14[-1][0xf] = 0;
        }
        pauVar23 = (undefined1 (*) [16])(pauVar14[-2] + 8);
        *(short *)(pauVar14[-1] + 10) = sVar5 + 1;
        psVar1 = (short *)(pauVar14[-1] + 0xc);
        *psVar1 = *psVar1 + -1;
        if (*psVar1 == 0) {
          if (pauVar14[-1][0xf] == '\x01') {
            uVar16 = (ulong)*(ushort *)(pauVar14[-1] + 8);
          }
          local_158 = *(undefined8 *)(pauVar14[-1] + 8);
          local_168 = *(undefined8 *)*pauVar23;
          uStack_160 = *(undefined8 *)pauVar14[-1];
          auVar24 = *pauVar23;
          *(undefined8 *)(pauVar14[-1] + 8) = *(undefined8 *)(pauVar20[-1] + 8);
          uVar10 = *(undefined8 *)pauVar20[-1];
          *(undefined8 *)*pauVar23 = *(undefined8 *)(pauVar20[-2] + 8);
          *(undefined8 *)pauVar14[-1] = uVar10;
          *(undefined8 *)(pauVar20[-1] + 8) = local_158;
          *(undefined1 (*) [16])(pauVar20[-2] + 8) = auVar24;
          pauVar20 = (undefined1 (*) [16])(pauVar20[-2] + 8);
        }
      }
      lVar18 = 0;
      auVar29 = ZEXT464((uint)uVar22);
      do {
        auVar31 = auVar29;
        auVar29 = vpbroadcastq_avx512f();
        auVar29 = vporq_avx512f(auVar29,auVar27);
        uVar22 = vpcmpuq_avx512f(auVar29,auVar28,1);
        auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_b8 + lVar18));
        auVar30._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * auVar29._8_8_;
        auVar30._0_8_ = (ulong)((byte)uVar22 & 1) * auVar29._0_8_;
        auVar30._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * auVar29._16_8_;
        auVar30._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * auVar29._24_8_;
        auVar30._32_8_ = (ulong)((byte)(uVar22 >> 4) & 1) * auVar29._32_8_;
        auVar30._40_8_ = (ulong)((byte)(uVar22 >> 5) & 1) * auVar29._40_8_;
        auVar30._48_8_ = (ulong)((byte)(uVar22 >> 6) & 1) * auVar29._48_8_;
        auVar30._56_8_ = (uVar22 >> 7) * auVar29._56_8_;
        auVar29 = vpopcntq_avx512_vpopcntdq(auVar30);
        auVar25 = vpmovqd_avx512f(auVar29);
        auVar25 = vpaddd_avx2(auVar31._0_32_,auVar25);
        lVar18 = lVar18 + 8;
        auVar29 = ZEXT3264(auVar25);
      } while (lVar18 != 0x18);
      auVar25 = vmovdqa32_avx512vl(auVar25);
      bVar8 = (bool)((byte)uVar22 & 1);
      auVar24._0_4_ = (uint)bVar8 * auVar25._0_4_ | (uint)!bVar8 * auVar31._0_4_;
      bVar8 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar8 * auVar25._4_4_ | (uint)!bVar8 * auVar31._4_4_;
      bVar8 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar8 * auVar25._8_4_ | (uint)!bVar8 * auVar31._8_4_;
      bVar8 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar8 * auVar25._12_4_ | (uint)!bVar8 * auVar31._12_4_;
      bVar8 = (bool)((byte)(uVar22 >> 4) & 1);
      auVar26._16_4_ = (uint)bVar8 * auVar25._16_4_ | (uint)!bVar8 * auVar31._16_4_;
      auVar26._0_16_ = auVar24;
      bVar8 = (bool)((byte)(uVar22 >> 5) & 1);
      auVar26._20_4_ = (uint)bVar8 * auVar25._20_4_ | (uint)!bVar8 * auVar31._20_4_;
      bVar8 = (bool)((byte)(uVar22 >> 6) & 1);
      auVar26._24_4_ = (uint)bVar8 * auVar25._24_4_ | (uint)!bVar8 * auVar31._24_4_;
      bVar8 = SUB81(uVar22 >> 7,0);
      auVar26._28_4_ = (uint)bVar8 * auVar25._28_4_ | (uint)!bVar8 * auVar31._28_4_;
      auVar24 = vphaddd_avx(auVar26._16_16_,auVar24);
      auVar24 = vphaddd_avx(auVar24,auVar24);
      auVar24 = vphaddd_avx(auVar24,auVar24);
      uVar22 = (ulong)auVar24._0_4_;
    } while (pauVar13 != pauVar20);
  }
  printf("Day 03 Part 1: %d\nDay 03 Part 2: %d\n",uVar22,uVar16);
  if (pauVar13 != (undefined1 (*) [16])0x0) {
    operator_delete(pauVar13,(long)pauVar21 - (long)pauVar13);
    return;
  }
  return;
}

Assistant:

void day03(input_t input) {
	std::vector<claim_t> v;
	v.reserve(1500);

	std::array<uint16_t, 5> arr;
	for (int n = 0, have = 0, i = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			n = 10 * n + c;
			have = 1;
		} else if (have) {
			arr[i++] = n;
			if (i == 5) {
				v.emplace_back(arr);
				i = 0;
			}
			n = have = 0;
		}
	}

	// Sort by starting y-index
	std::sort(v.begin(), v.end());

	int part1 = 0, part2 = 0;

	/* Sweep vertically down the fabric, one row at a time,
	 * checking for collisions between claims.
	 */
	std::array<uint64_t, 17> row, collide;
	while (!v.empty()) {
		row.fill(0);
		collide.fill(0);

		auto y = v.back().y;
		for (auto vi = v.rbegin(); vi != v.rend() && vi->y == y; vi++) {
			collide[vi->idx + 0] |= row[vi->idx + 0] & vi->mask0;
			row[vi->idx + 0] |= vi->mask0;
			collide[vi->idx + 1] |= row[vi->idx + 1] & vi->mask1;
			row[vi->idx + 1] |= vi->mask1;
		}

		for (auto vi = v.rbegin(); vi != v.rend() && vi->y == y; vi++) {
			if (vi->part2) {
				if ((collide[vi->idx + 0] & vi->mask0) ||
				    (collide[vi->idx + 1] & vi->mask1))
				{
					vi->part2 = false;
				}
			}

			vi->y++;
			if (--vi->h == 0) {
				/* Reached the bottom of this claim; check for
				 * part2 solution and remove the claim
				 */
				if (vi->part2) {
					part2 = vi->id;
				}
				std::swap(*vi, v.back());
				v.pop_back();
			}
		}

		// Just tally up the 1-bits for part1
		for (auto c : collide) {
			part1 += _mm_popcnt_u64(c);
		}
	}

	printf("Day 03 Part 1: %d\nDay 03 Part 2: %d\n", part1, part2);
}